

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O2

ON_3dPoint * __thiscall
ON_BoundingBox::ClosestPoint
          (ON_3dPoint *__return_storage_ptr__,ON_BoundingBox *this,ON_3dPoint *test_point)

{
  double dVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  
  __return_storage_ptr__->z = test_point->z;
  dVar1 = test_point->y;
  __return_storage_ptr__->x = test_point->x;
  __return_storage_ptr__->y = dVar1;
  dVar1 = (this->m_min).x;
  uVar2 = SUB84(dVar1,0);
  uVar3 = (undefined4)((ulong)dVar1 >> 0x20);
  if (test_point->x < dVar1) {
LAB_00408742:
    __return_storage_ptr__->x = (double)CONCAT44(uVar3,uVar2);
  }
  else {
    dVar1 = (this->m_max).x;
    uVar2 = SUB84(dVar1,0);
    uVar3 = (undefined4)((ulong)dVar1 >> 0x20);
    if (dVar1 < test_point->x) goto LAB_00408742;
  }
  dVar1 = (this->m_min).y;
  uVar2 = SUB84(dVar1,0);
  uVar3 = (undefined4)((ulong)dVar1 >> 0x20);
  if (dVar1 <= test_point->y) {
    dVar1 = (this->m_max).y;
    uVar2 = SUB84(dVar1,0);
    uVar3 = (undefined4)((ulong)dVar1 >> 0x20);
    if (test_point->y <= dVar1) goto LAB_00408766;
  }
  __return_storage_ptr__->y = (double)CONCAT44(uVar3,uVar2);
LAB_00408766:
  dVar1 = (this->m_min).z;
  uVar2 = SUB84(dVar1,0);
  uVar3 = (undefined4)((ulong)dVar1 >> 0x20);
  if (dVar1 <= test_point->z) {
    dVar1 = (this->m_max).z;
    uVar2 = SUB84(dVar1,0);
    uVar3 = (undefined4)((ulong)dVar1 >> 0x20);
    if (test_point->z <= dVar1) {
      return __return_storage_ptr__;
    }
  }
  __return_storage_ptr__->z = (double)CONCAT44(uVar3,uVar2);
  return __return_storage_ptr__;
}

Assistant:

ON_3dPoint ON_BoundingBox::ClosestPoint( 
  const ON_3dPoint& test_point
  ) const
{
  ON_3dPoint near_point = test_point;
	// GBA  30 March 04.  For performance reasons in closest point to surface
	//this function	no longer validates the bounding box. 
  if ( test_point.x < m_min.x )
    near_point.x = m_min.x;
  else if ( test_point.x > m_max.x )
    near_point.x = m_max.x;
  if ( test_point.y < m_min.y )
    near_point.y = m_min.y;
  else if ( test_point.y > m_max.y )
    near_point.y = m_max.y;
  if ( test_point.z < m_min.z )
    near_point.z = m_min.z;
  else if ( test_point.z > m_max.z )
    near_point.z = m_max.z;
  return near_point;
}